

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

string * __thiscall
cmGeneratorTarget::EvaluateInterfaceProperty
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *prop,
          cmGeneratorExpressionContext *context,cmGeneratorExpressionDAGChecker *dagCheckerParent,
          LinkInterfaceFor interfaceFor)

{
  bool bVar1;
  cmLocalGenerator *lg;
  cmValue headTarget_00;
  bool bVar2;
  Result RVar3;
  string *psVar4;
  cmLinkInterfaceLibraries *this_00;
  ulong uVar5;
  byte local_43a;
  byte local_439;
  byte local_411;
  cmGeneratorTarget *local_400;
  string local_3c0;
  undefined1 local_3a0 [8];
  string libResult;
  cmListFileBacktrace local_360;
  string local_350;
  undefined1 local_330 [8];
  cmGeneratorExpressionContext libContext;
  cmLinkItem *lib;
  const_iterator __end2;
  const_iterator __begin2;
  vector<cmLinkItem,_std::allocator<cmLinkItem>_> *__range2;
  cmLinkInterfaceLibraries *iface;
  cmValue local_188;
  cmValue p;
  cmGeneratorTarget *headTarget;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  string local_f8;
  cmListFileBacktrace local_d8;
  undefined1 local_c8 [8];
  cmGeneratorExpressionDAGChecker dagChecker;
  LinkInterfaceFor interfaceFor_local;
  cmGeneratorExpressionDAGChecker *dagCheckerParent_local;
  cmGeneratorExpressionContext *context_local;
  string *prop_local;
  cmGeneratorTarget *this_local;
  string *result;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  bVar2 = MaybeHaveInterfaceProperty(this,prop,context,interfaceFor);
  if (!bVar2) {
    return __return_storage_ptr__;
  }
  cmListFileBacktrace::cmListFileBacktrace(&local_d8,&context->Backtrace);
  std::__cxx11::string::string((string *)&local_f8,(string *)prop);
  cmGeneratorExpressionDAGChecker::cmGeneratorExpressionDAGChecker
            ((cmGeneratorExpressionDAGChecker *)local_c8,&local_d8,this,&local_f8,
             (GeneratorExpressionContent *)0x0,dagCheckerParent);
  std::__cxx11::string::~string((string *)&local_f8);
  cmListFileBacktrace::~cmListFileBacktrace(&local_d8);
  RVar3 = cmGeneratorExpressionDAGChecker::Check((cmGeneratorExpressionDAGChecker *)local_c8);
  if (RVar3 != DAG) {
    if (RVar3 == SELF_REFERENCE) {
      psVar4 = GetName_abi_cxx11_(this);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &headTarget,"$<TARGET_PROPERTY:",psVar4);
      std::operator+(&local_158,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &headTarget,",");
      std::operator+(&local_138,&local_158,prop);
      std::operator+(&local_118,&local_138,">");
      cmGeneratorExpressionDAGChecker::ReportError
                ((cmGeneratorExpressionDAGChecker *)local_c8,context,&local_118);
      std::__cxx11::string::~string((string *)&local_118);
      std::__cxx11::string::~string((string *)&local_138);
      std::__cxx11::string::~string((string *)&local_158);
      std::__cxx11::string::~string((string *)&headTarget);
      goto LAB_00712a56;
    }
    if (RVar3 - CYCLIC_REFERENCE < 2) goto LAB_00712a56;
  }
  local_400 = this;
  if (context->HeadTarget != (cmGeneratorTarget *)0x0) {
    local_400 = context->HeadTarget;
  }
  p.Value = (string *)local_400;
  local_188 = GetProperty(this,prop);
  bVar2 = cmValue::operator_cast_to_bool(&local_188);
  if (bVar2) {
    psVar4 = cmValue::operator*[abi_cxx11_(&local_188);
    cmGeneratorExpressionNode::EvaluateDependentExpression
              ((string *)&iface,psVar4,context->LG,context,(cmGeneratorTarget *)p.Value,
               (cmGeneratorExpressionDAGChecker *)local_c8,this);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&iface);
    std::__cxx11::string::~string((string *)&iface);
  }
  this_00 = GetLinkInterfaceLibraries
                      (this,&context->Config,(cmGeneratorTarget *)p.Value,interfaceFor);
  if (this_00 != (cmLinkInterfaceLibraries *)0x0) {
    local_411 = 1;
    if ((context->HadContextSensitiveCondition & 1U) == 0) {
      local_411 = this_00->HadContextSensitiveCondition;
    }
    context->HadContextSensitiveCondition = (bool)(local_411 & 1);
    __end2 = std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::begin(&this_00->Libraries);
    lib = (cmLinkItem *)
          std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::end(&this_00->Libraries);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_cmLinkItem_*,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>
                                       *)&lib), bVar2) {
      libContext._344_8_ =
           __gnu_cxx::
           __normal_iterator<const_cmLinkItem_*,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>
           ::operator*(&__end2);
      if ((((reference)libContext._344_8_)->Target != (cmGeneratorTarget *)0x0) &&
         (((reference)libContext._344_8_)->Target != this)) {
        lg = context->LG;
        std::__cxx11::string::string((string *)&local_350,(string *)&context->Config);
        headTarget_00 = p;
        bVar2 = context->Quiet;
        bVar1 = context->EvaluateForBuildsystem;
        cmListFileBacktrace::cmListFileBacktrace(&local_360,&context->Backtrace);
        std::__cxx11::string::string
                  ((string *)(libResult.field_2._M_local_buf + 8),(string *)&context->Language);
        cmGeneratorExpressionContext::cmGeneratorExpressionContext
                  ((cmGeneratorExpressionContext *)local_330,lg,&local_350,(bool)(bVar2 & 1),
                   (cmGeneratorTarget *)headTarget_00.Value,this,(bool)(bVar1 & 1),&local_360,
                   (string *)((long)&libResult.field_2 + 8));
        std::__cxx11::string::~string((string *)(libResult.field_2._M_local_buf + 8));
        cmListFileBacktrace::~cmListFileBacktrace(&local_360);
        std::__cxx11::string::~string((string *)&local_350);
        EvaluateInterfaceProperty
                  (&local_3c0,*(cmGeneratorTarget **)(libContext._344_8_ + 0x20),prop,
                   (cmGeneratorExpressionContext *)local_330,
                   (cmGeneratorExpressionDAGChecker *)local_c8,interfaceFor);
        cmGeneratorExpression::StripEmptyListElements((string *)local_3a0,&local_3c0);
        std::__cxx11::string::~string((string *)&local_3c0);
        uVar5 = std::__cxx11::string::empty();
        if ((uVar5 & 1) == 0) {
          uVar5 = std::__cxx11::string::empty();
          if ((uVar5 & 1) == 0) {
            std::__cxx11::string::size();
            std::__cxx11::string::size();
            std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
            std::__cxx11::string::operator+=((string *)__return_storage_ptr__,";");
            std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)local_3a0);
          }
          else {
            std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_3a0);
          }
        }
        local_439 = 1;
        if ((context->HadContextSensitiveCondition & 1U) == 0) {
          local_439 = libContext.CurrentTarget._2_1_;
        }
        context->HadContextSensitiveCondition = (bool)(local_439 & 1);
        local_43a = 1;
        if ((context->HadHeadSensitiveCondition & 1U) == 0) {
          local_43a = libContext.CurrentTarget._3_1_;
        }
        context->HadHeadSensitiveCondition = (bool)(local_43a & 1);
        std::__cxx11::string::~string((string *)local_3a0);
        cmGeneratorExpressionContext::~cmGeneratorExpressionContext
                  ((cmGeneratorExpressionContext *)local_330);
      }
      __gnu_cxx::
      __normal_iterator<const_cmLinkItem_*,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>::
      operator++(&__end2);
    }
  }
LAB_00712a56:
  dagChecker.CheckResult = SELF_REFERENCE;
  cmGeneratorExpressionDAGChecker::~cmGeneratorExpressionDAGChecker
            ((cmGeneratorExpressionDAGChecker *)local_c8);
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::EvaluateInterfaceProperty(
  std::string const& prop, cmGeneratorExpressionContext* context,
  cmGeneratorExpressionDAGChecker* dagCheckerParent,
  LinkInterfaceFor interfaceFor) const
{
  std::string result;

  // If the property does not appear transitively at all, we are done.
  if (!this->MaybeHaveInterfaceProperty(prop, context, interfaceFor)) {
    return result;
  }

  // Evaluate $<TARGET_PROPERTY:this,prop> as if it were compiled.  This is
  // a subset of TargetPropertyNode::Evaluate without stringify/parse steps
  // but sufficient for transitive interface properties.
  cmGeneratorExpressionDAGChecker dagChecker(context->Backtrace, this, prop,
                                             nullptr, dagCheckerParent);
  switch (dagChecker.Check()) {
    case cmGeneratorExpressionDAGChecker::SELF_REFERENCE:
      dagChecker.ReportError(
        context, "$<TARGET_PROPERTY:" + this->GetName() + "," + prop + ">");
      return result;
    case cmGeneratorExpressionDAGChecker::CYCLIC_REFERENCE:
      // No error. We just skip cyclic references.
    case cmGeneratorExpressionDAGChecker::ALREADY_SEEN:
      // No error. We have already seen this transitive property.
      return result;
    case cmGeneratorExpressionDAGChecker::DAG:
      break;
  }

  cmGeneratorTarget const* headTarget =
    context->HeadTarget ? context->HeadTarget : this;

  if (cmValue p = this->GetProperty(prop)) {
    result = cmGeneratorExpressionNode::EvaluateDependentExpression(
      *p, context->LG, context, headTarget, &dagChecker, this);
  }

  if (cmLinkInterfaceLibraries const* iface = this->GetLinkInterfaceLibraries(
        context->Config, headTarget, interfaceFor)) {
    context->HadContextSensitiveCondition =
      context->HadContextSensitiveCondition ||
      iface->HadContextSensitiveCondition;
    for (cmLinkItem const& lib : iface->Libraries) {
      // Broken code can have a target in its own link interface.
      // Don't follow such link interface entries so as not to create a
      // self-referencing loop.
      if (lib.Target && lib.Target != this) {
        // Pretend $<TARGET_PROPERTY:lib.Target,prop> appeared in the
        // above property and hand-evaluate it as if it were compiled.
        // Create a context as cmCompiledGeneratorExpression::Evaluate does.
        cmGeneratorExpressionContext libContext(
          context->LG, context->Config, context->Quiet, headTarget, this,
          context->EvaluateForBuildsystem, context->Backtrace,
          context->Language);
        std::string libResult = cmGeneratorExpression::StripEmptyListElements(
          lib.Target->EvaluateInterfaceProperty(prop, &libContext, &dagChecker,
                                                interfaceFor));
        if (!libResult.empty()) {
          if (result.empty()) {
            result = std::move(libResult);
          } else {
            result.reserve(result.size() + 1 + libResult.size());
            result += ";";
            result += libResult;
          }
        }
        context->HadContextSensitiveCondition =
          context->HadContextSensitiveCondition ||
          libContext.HadContextSensitiveCondition;
        context->HadHeadSensitiveCondition =
          context->HadHeadSensitiveCondition ||
          libContext.HadHeadSensitiveCondition;
      }
    }
  }

  return result;
}